

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O3

int __thiscall
Parse::TPTP::addPredicate(TPTP *this,string *name,int arity,bool *added,TermList *arg)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  TermList TVar4;
  TermList TVar5;
  UserErrorException *this_00;
  _Alloc_hider _Var6;
  TermList *added_00;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  added_00 = arg;
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    return -1;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    return -1;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    uVar3 = addOverloadedPredicate
                      (this,&local_50,arity,2,(bool *)added_00,arg,INT_LESS,RAT_LESS,REAL_LESS);
    _Var6._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return uVar3;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
      uVar3 = addOverloadedPredicate
                        (this,&local_70,arity,2,(bool *)added_00,arg,INT_LESS_EQUAL,RAT_LESS_EQUAL,
                         REAL_LESS_EQUAL);
      local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      _Var6._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return uVar3;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        pcVar1 = (name->_M_dataplus)._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
        uVar3 = addOverloadedPredicate
                          (this,&local_90,arity,2,(bool *)added_00,arg,INT_GREATER,RAT_GREATER,
                           REAL_GREATER);
        local_50.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
        _Var6._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return uVar3;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          pcVar1 = (name->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
          uVar3 = addOverloadedPredicate
                            (this,&local_b0,arity,2,(bool *)added_00,arg,INT_GREATER_EQUAL,
                             RAT_GREATER_EQUAL,REAL_GREATER_EQUAL);
          local_50.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
          _Var6._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
            return uVar3;
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 == 0) {
            pcVar1 = (name->_M_dataplus)._M_p;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
            uVar3 = addOverloadedPredicate
                              (this,&local_d0,arity,1,(bool *)added_00,arg,INT_IS_INT,RAT_IS_INT,
                               REAL_IS_INT);
            local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
            _Var6._M_p = local_d0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
              return uVar3;
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 == 0) {
              TVar4 = sortOf(this,arg->_content);
              TVar5 = Kernel::AtomicSort::intSort();
              if (TVar4._content != TVar5._content) {
                this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
                Lib::UserErrorException::Exception
                          (this_00,"$divides can only be used with integer type");
                __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                            Lib::UserErrorException::~UserErrorException);
              }
              pcVar1 = (name->_M_dataplus)._M_p;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
              uVar3 = addOverloadedPredicate
                                (this,&local_f0,arity,2,(bool *)added_00,arg,INT_DIVIDES,INT_DIVIDES
                                 ,INT_DIVIDES);
              local_50.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
              _Var6._M_p = local_f0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
                return uVar3;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)name);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)name);
                if (iVar2 == 0) {
                  return -2;
                }
                uVar3 = Kernel::Signature::addPredicate(DAT_00b521b0,name,arity,added);
                return uVar3;
              }
              pcVar1 = (name->_M_dataplus)._M_p;
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,pcVar1,pcVar1 + name->_M_string_length);
              uVar3 = addOverloadedPredicate
                                (this,&local_110,arity,1,(bool *)added_00,arg,INT_IS_RAT,RAT_IS_RAT,
                                 REAL_IS_RAT);
              local_50.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
              _Var6._M_p = local_110._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p == &local_110.field_2) {
                return uVar3;
              }
            }
          }
        }
      }
    }
  }
  operator_delete(_Var6._M_p,local_50.field_2._M_allocated_capacity + 1);
  return uVar3;
}

Assistant:

int TPTP::addPredicate(std::string name,int arity,bool& added,TermList& arg)
{
  if (name == "$evaleq" || name == "$equal") {
    return -1;
  }
  if (name == "$less") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS,
				  Theory::RAT_LESS,
				  Theory::REAL_LESS);
  }
  if (name == "$lesseq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS_EQUAL,
				  Theory::RAT_LESS_EQUAL,
				  Theory::REAL_LESS_EQUAL);
  }
  if (name == "$greater") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER,
				  Theory::RAT_GREATER,
				  Theory::REAL_GREATER);
  }
  if (name == "$greatereq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER_EQUAL,
				  Theory::RAT_GREATER_EQUAL,
				  Theory::REAL_GREATER_EQUAL);
  }
  if (name == "$is_int") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_INT,
				  Theory::RAT_IS_INT,
				  Theory::REAL_IS_INT);
  }
  if (name == "$divides"){
    if(sortOf(arg)!=AtomicSort::intSort()){
      USER_ERROR("$divides can only be used with integer type");
    }
    return addOverloadedPredicate(name,arity,2,added,arg,
                                  Theory::INT_DIVIDES,
                                  Theory::INT_DIVIDES,  // will not be used
                                  Theory::INT_DIVIDES); // will not be used
  }
  if (name == "$is_rat") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_RAT,
				  Theory::RAT_IS_RAT,
				  Theory::REAL_IS_RAT);
  } 
  if(name == "$distinct"){
    // special case for distinct, dealt with in formulaInfix
    return -2;
  }
  return env.signature->addPredicate(name,arity,added);
}